

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O2

ReorganizeDataLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_reorganizedata(NeuralNetworkLayer *this)

{
  LayerUnion this_00;
  
  if (this->_oneof_case_[0] == 0x159) {
    this_00 = this->layer_;
  }
  else {
    clear_layer(this);
    this->_oneof_case_[0] = 0x159;
    this_00.convolution_ = (ConvolutionLayerParams *)operator_new(0x20);
    ReorganizeDataLayerParams::ReorganizeDataLayerParams(this_00.reorganizedata_);
    (this->layer_).reorganizedata_ = (ReorganizeDataLayerParams *)this_00;
  }
  return (ReorganizeDataLayerParams *)this_00.convolution_;
}

Assistant:

inline ::CoreML::Specification::ReorganizeDataLayerParams* NeuralNetworkLayer::mutable_reorganizedata() {
  if (!has_reorganizedata()) {
    clear_layer();
    set_has_reorganizedata();
    layer_.reorganizedata_ = new ::CoreML::Specification::ReorganizeDataLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.reorganizeData)
  return layer_.reorganizedata_;
}